

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

EnumValueDescriptor * __thiscall
google::protobuf::EnumDescriptor::FindValueByName(EnumDescriptor *this,string *key)

{
  long lVar1;
  ulong uVar2;
  char *__s1;
  char cVar3;
  int iVar4;
  EnumValueDescriptor *pEVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  char *pcVar9;
  long *plVar10;
  
  lVar1 = *(long *)(*(long *)(*(long *)(this + 0x10) + 0x90) + 8);
  uVar2 = *(ulong *)(*(long *)(*(long *)(this + 0x10) + 0x90) + 0x10);
  __s1 = (key->_M_dataplus)._M_p;
  cVar3 = *__s1;
  if (cVar3 == '\0') {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    pcVar9 = __s1;
    do {
      pcVar9 = pcVar9 + 1;
      lVar6 = (long)cVar3 + lVar6 * 5;
      cVar3 = *pcVar9;
    } while (cVar3 != '\0');
  }
  plVar10 = *(long **)(lVar1 + ((ulong)((long)this * 0xffff + lVar6) % uVar2) * 8);
  do {
    if (plVar10 == (long *)0x0) {
      plVar7 = *(long **)(lVar1 + uVar2 * 8);
      plVar10 = plVar7;
LAB_001cb9d5:
      plVar8 = plVar10 + 2;
      if (plVar10 == plVar7) {
        plVar8 = (long *)&(anonymous_namespace)::kNullSymbol;
      }
      pEVar5 = (EnumValueDescriptor *)0x0;
      if ((anonymous_namespace)::kNullSymbol != 0) {
        pEVar5 = DAT_002925f8;
      }
      if ((int)*plVar8 == 4) {
        pEVar5 = (EnumValueDescriptor *)plVar8[1];
      }
      return pEVar5;
    }
    if (((EnumDescriptor *)*plVar10 == this) &&
       (iVar4 = strcmp(__s1,(char *)plVar10[1]), iVar4 == 0)) {
      plVar7 = *(long **)(lVar1 + uVar2 * 8);
      goto LAB_001cb9d5;
    }
    plVar10 = (long *)plVar10[4];
  } while( true );
}

Assistant:

const EnumValueDescriptor*
EnumDescriptor::FindValueByName(const string& key) const {
  Symbol result =
    file()->tables_->FindNestedSymbolOfType(this, key, Symbol::ENUM_VALUE);
  if (!result.IsNull()) {
    return result.enum_value_descriptor;
  } else {
    return NULL;
  }
}